

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O2

int __thiscall rcg::Stream::open(Stream *this,char *__file,int __oflag,...)

{
  PDevOpenDataStream p_Var1;
  GC_ERROR GVar2;
  int iVar3;
  void *pvVar4;
  GenTLException *pGVar5;
  allocator local_49;
  string local_48;
  
  std::recursive_mutex::lock(&this->mtx);
  iVar3 = this->n_open;
  if (iVar3 == 0) {
    pvVar4 = Device::getHandle((this->parent).
                               super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (pvVar4 == (void *)0x0) {
      pGVar5 = (GenTLException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_48,
                 "Stream::open(): Device must be opened before open before opening a stream",
                 &local_49);
      GenTLException::GenTLException(pGVar5,&local_48);
      __cxa_throw(pGVar5,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
    p_Var1 = ((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->DevOpenDataStream;
    pvVar4 = Device::getHandle((this->parent).
                               super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    GVar2 = (*p_Var1)(pvVar4,(this->id)._M_dataplus._M_p,&this->stream);
    if (GVar2 != 0) {
      pGVar5 = (GenTLException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_48,"Stream::open()",&local_49);
      GenTLException::GenTLException(pGVar5,&local_48,&this->gentl);
      __cxa_throw(pGVar5,&GenTLException::typeinfo,GenTLException::~GenTLException);
    }
    iVar3 = this->n_open;
  }
  this->n_open = iVar3 + 1;
  iVar3 = pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return iVar3;
}

Assistant:

void Stream::open()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);

  if (n_open == 0)
  {
    if (parent->getHandle() != 0)
    {
      if (gentl->DevOpenDataStream(parent->getHandle(), id.c_str(), &stream) !=
          GenTL::GC_ERR_SUCCESS)
      {
        throw GenTLException("Stream::open()", gentl);
      }
    }
    else
    {
      throw GenTLException("Stream::open(): Device must be opened before open before opening a stream");
    }
  }

  n_open++;
}